

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AbstractDOMParser::XMLDecl
          (AbstractDOMParser *this,XMLCh *version,XMLCh *encoding,XMLCh *standalone,
          XMLCh *actualEncStr)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLCh *pXVar3;
  bool bVar4;
  
  if (standalone == L"yes") {
    bVar4 = true;
  }
  else if (standalone == (XMLCh *)0x0) {
    standalone = L"yes";
LAB_002d6f58:
    bVar4 = *standalone == L'\0';
  }
  else {
    pXVar3 = L"yes";
    do {
      XVar1 = *pXVar3;
      if (XVar1 == L'\0') goto LAB_002d6f58;
      pXVar3 = pXVar3 + 1;
      XVar2 = *standalone;
      standalone = standalone + 1;
    } while (XVar1 == XVar2);
    bVar4 = false;
  }
  (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x59])
            (this->fDocument,(ulong)bVar4);
  (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x5b])(this->fDocument,version)
  ;
  DOMDocumentImpl::setXmlEncoding(this->fDocument,encoding);
  DOMDocumentImpl::setInputEncoding(this->fDocument,actualEncStr);
  return;
}

Assistant:

void AbstractDOMParser::XMLDecl(const   XMLCh* const version
                                , const XMLCh* const encoding
                                , const XMLCh* const standalone
                                , const XMLCh* const actualEncStr)
{
    fDocument->setXmlStandalone(XMLString::equals(XMLUni::fgYesString, standalone));
    fDocument->setXmlVersion(version);
    fDocument->setXmlEncoding(encoding);
    fDocument->setInputEncoding(actualEncStr);
}